

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

bool __thiscall clipp::param_filter::operator()(param_filter *this,parameter *p)

{
  bool bVar1;
  tri tVar2;
  byte bVar3;
  ulong uVar4;
  arg_list *paVar5;
  const_iterator __first;
  const_iterator __last;
  parameter *p_local;
  param_filter *this_local;
  
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    paVar5 = parameter::flags_abi_cxx11_(p);
    __first = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin(paVar5);
    paVar5 = parameter::flags_abi_cxx11_(p);
    __last = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(paVar5);
    bVar1 = std::operator()((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )__first._M_current,
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )__last._M_current,(anon_class_8_1_8991fb9c_for__M_pred)this);
    if (!bVar1) {
      return false;
    }
  }
  tVar2 = required(this);
  bVar1 = parameter::required(p);
  bVar1 = clipp::operator!=(tVar2,bVar1);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    tVar2 = blocking(this);
    bVar1 = detail::token<clipp::parameter>::blocking(&p->super_token<clipp::parameter>);
    bVar1 = clipp::operator!=(tVar2,bVar1);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      tVar2 = repeatable(this);
      bVar1 = detail::token<clipp::parameter>::repeatable(&p->super_token<clipp::parameter>);
      bVar1 = clipp::operator!=(tVar2,bVar1);
      if (bVar1) {
        this_local._7_1_ = false;
      }
      else {
        tVar2 = has_doc(this);
        detail::token<clipp::parameter>::doc_abi_cxx11_(&p->super_token<clipp::parameter>);
        bVar3 = std::__cxx11::string::empty();
        bVar1 = clipp::operator!=(tVar2,(bool)((bVar3 ^ 0xff) & 1));
        if (bVar1) {
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = true;
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool operator() (const parameter& p) const noexcept {
        if(!prefix_.empty()) {
            if(!std::any_of(p.flags().begin(), p.flags().end(),
                [&](const arg_string& flag){
                    return str::has_prefix(flag, prefix_);
                })) return false;
        }
        if(required()   != p.required())     return false;
        if(blocking()   != p.blocking())     return false;
        if(repeatable() != p.repeatable())   return false;
        if(has_doc()    != !p.doc().empty()) return false;
        return true;
    }